

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O0

bool __thiscall
irr::gui::CGUITabControl::needScrollControl
          (CGUITabControl *this,s32 startIndex,bool withScrollControl,s32 *pos_rightmost)

{
  bool bVar1;
  wchar_t wVar2;
  u32 uVar3;
  int iVar4;
  long *plVar5;
  long lVar6;
  IGUITab **ppIVar7;
  undefined4 extraout_var;
  wchar_t *in_RCX;
  byte in_DL;
  int in_ESI;
  wchar_t *in_RDI;
  rect<int> rVar8;
  s32 len;
  wchar_t *text;
  s32 i;
  s32 pos_right;
  s32 pos;
  IGUIFont *font;
  IGUISkin *skin;
  u32 in_stack_ffffffffffffff8c;
  wchar_t wVar9;
  undefined4 in_stack_ffffffffffffffa0;
  s32 in_stack_ffffffffffffffa4;
  int local_4c;
  int local_48;
  wchar_t local_34;
  int local_14;
  
  local_14 = in_ESI;
  if (in_ESI < 0) {
    local_14 = 0;
  }
  plVar5 = (long *)(**(code **)(**(long **)(in_RDI + 0x4a) + 0x60))();
  if (plVar5 != (long *)0x0) {
    lVar6 = (**(code **)(*plVar5 + 0x30))(plVar5,0);
    bVar1 = core::array<irr::gui::IGUITab_*>::empty((array<irr::gui::IGUITab_*> *)0x3d034f);
    if ((!bVar1) && (lVar6 != 0)) {
      local_34 = in_RDI[0x10] + L'\x02';
      if ((in_DL & 1) == 0) {
        wVar2 = in_RDI[0x12];
      }
      else {
        rVar8 = IGUIElement::getAbsolutePosition(*(IGUIElement **)(in_RDI + 0x5a));
        local_48 = rVar8.UpperLeftCorner.X;
        wVar2 = local_48 + L'\xfffffffe';
      }
      local_4c = local_14;
      wVar9 = wVar2;
      while (iVar4 = local_4c,
            uVar3 = core::array<irr::gui::IGUITab_*>::size((array<irr::gui::IGUITab_*> *)0x3d03e4),
            iVar4 < (int)uVar3) {
        ppIVar7 = core::array<irr::gui::IGUITab_*>::operator[]
                            ((array<irr::gui::IGUITab_*> *)CONCAT44(wVar9,iVar4),
                             in_stack_ffffffffffffff8c);
        if (*ppIVar7 != (IGUITab *)0x0) {
          ppIVar7 = core::array<irr::gui::IGUITab_*>::operator[]
                              ((array<irr::gui::IGUITab_*> *)CONCAT44(wVar9,iVar4),
                               in_stack_ffffffffffffff8c);
          iVar4 = (*((*ppIVar7)->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x15])
                            ();
          in_stack_ffffffffffffffa4 =
               calcTabWidth((CGUITabControl *)CONCAT44(extraout_var,iVar4),
                            (IGUIFont *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_RDI);
          local_34 = in_stack_ffffffffffffffa4 + local_34;
        }
        if (wVar2 < local_34) {
          return true;
        }
        local_4c = local_4c + 1;
      }
      if (in_RCX != (wchar_t *)0x0) {
        *in_RCX = local_34;
      }
    }
  }
  return false;
}

Assistant:

bool CGUITabControl::needScrollControl(s32 startIndex, bool withScrollControl, s32 *pos_rightmost)
{
	if (startIndex < 0)
		startIndex = 0;

	IGUISkin *skin = Environment->getSkin();
	if (!skin)
		return false;

	IGUIFont *font = skin->getFont();

	if (Tabs.empty())
		return false;

	if (!font)
		return false;

	s32 pos = AbsoluteRect.UpperLeftCorner.X + 2;
	const s32 pos_right = withScrollControl ? UpButton->getAbsolutePosition().UpperLeftCorner.X - 2 : AbsoluteRect.LowerRightCorner.X;

	for (s32 i = startIndex; i < (s32)Tabs.size(); ++i) {
		// get Text
		const wchar_t *text = 0;
		if (Tabs[i]) {
			text = Tabs[i]->getText();

			// get text length
			s32 len = calcTabWidth(font, text); // always without withScrollControl here or len would be shortened
			pos += len;
		}

		if (pos > pos_right)
			return true;
	}

	if (pos_rightmost)
		*pos_rightmost = pos;
	return false;
}